

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

RecyclableObject * __thiscall
Js::JavascriptLibrary::CreateRevokeFunction_TTD(JavascriptLibrary *this,RecyclableObject *proxy)

{
  Recycler *recycler;
  RuntimeFunction *this_00;
  DynamicType *type;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  local_58 = (undefined1  [8])&RuntimeFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x15c8;
  recycler = Memory::Recycler::TrackAllocInfo
                       (((this->super_JavascriptLibraryBase).scriptContext.ptr)->recycler,
                        (TrackAllocData *)local_58);
  this_00 = (RuntimeFunction *)
            new<(Memory::ObjectInfoBits)1>
                      (0x40,recycler,(InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27)
  ;
  type = CreateFunctionWithLengthType(this,(FunctionInfo *)JavascriptProxy::EntryInfo::Revoke);
  RuntimeFunction::RuntimeFunction(this_00,type,(FunctionInfo *)JavascriptProxy::EntryInfo::Revoke);
  (*(this_00->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (this_00,0xd1,0x1000000000000,0,0,0,0xf);
  (*(this_00->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x19])
            (this_00,0xd,proxy,8,0);
  return (RecyclableObject *)this_00;
}

Assistant:

Js::RecyclableObject* JavascriptLibrary::CreateRevokeFunction_TTD(RecyclableObject* proxy)
    {
        RuntimeFunction* revoker = RecyclerNewEnumClass(this->scriptContext->GetRecycler(), JavascriptLibrary::EnumFunctionClass, RuntimeFunction, this->CreateFunctionWithLengthType(&JavascriptProxy::EntryInfo::Revoke), &JavascriptProxy::EntryInfo::Revoke);

        revoker->SetPropertyWithAttributes(Js::PropertyIds::length, Js::TaggedInt::ToVarUnchecked(0), PropertyNone, NULL);
        revoker->SetInternalProperty(Js::InternalPropertyIds::RevocableProxy, proxy, PropertyOperationFlags::PropertyOperation_Force, nullptr);

        return revoker;
    }